

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print_log_messages.cpp
# Opt level: O0

void HandleMessageCallback(Message *message,void *userData)

{
  hrgls_MessageLevel hVar1;
  ostream *poVar2;
  string local_40 [32];
  void *local_20;
  size_t *count;
  void *userData_local;
  Message *message_local;
  
  *(long *)userData = *userData + 1;
  local_20 = userData;
  count = (size_t *)userData;
  userData_local = message;
  poVar2 = std::operator<<((ostream *)&std::cout,"Callback message with level ");
  hVar1 = hrgls::Message::Level((Message *)userData_local);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,hVar1);
  poVar2 = std::operator<<(poVar2," received: ");
  hrgls::Message::Value_abi_cxx11_((Message *)local_40);
  poVar2 = std::operator<<(poVar2,local_40);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void HandleMessageCallback(hrgls::Message &message, void *userData)
{
  // Increment to keep track of how many messages arrived.
  size_t *count = static_cast<size_t*>(userData);
  (*count)++;

  // Print the message
  std::cout << "Callback message with level " << message.Level()
    << " received: " << message.Value() << std::endl;
}